

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_neon_negl(TCGContext_conflict1 *tcg_ctx,TCGv_i64 var,int size)

{
  int size_local;
  TCGv_i64 var_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  if (size == 0) {
    gen_helper_neon_negl_u16(tcg_ctx,var,var);
  }
  else if (size == 1) {
    gen_helper_neon_negl_u32(tcg_ctx,var,var);
  }
  else {
    if (size != 2) {
      abort();
    }
    tcg_gen_neg_i64(tcg_ctx,var,var);
  }
  return;
}

Assistant:

static inline void gen_neon_negl(TCGContext *tcg_ctx, TCGv_i64 var, int size)
{
    switch (size) {
    case 0: gen_helper_neon_negl_u16(tcg_ctx, var, var); break;
    case 1: gen_helper_neon_negl_u32(tcg_ctx, var, var); break;
    case 2:
        tcg_gen_neg_i64(tcg_ctx, var, var);
        break;
    default: abort();
    }
}